

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::print
          (tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *this,QDomDocument *doc,
          QDomElement *parent)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  *this_00;
  reference pptVar3;
  char16_t *in_RDX;
  QString *in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  child_tags_list_t *__range4;
  string_t *in_stack_00000068;
  QString tmp;
  string_t value;
  QString *v;
  const_iterator __end0;
  const_iterator __begin0;
  values_vector_t *__range3;
  size_type i;
  QDomElement this_element;
  QString *in_stack_fffffffffffffe68;
  QString *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe86;
  byte in_stack_fffffffffffffe87;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe88;
  QString *s2;
  QString *s1;
  QString *this_01;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_140;
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  *local_138;
  undefined1 local_130 [48];
  QString local_100;
  undefined1 local_e8 [28];
  ushort local_cc;
  ushort local_ca;
  QString local_c8 [2];
  QString local_98;
  reference local_80;
  QString *local_78;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_70;
  tag_t<cfgfile::qstring_trait_t> *local_68;
  long local_60;
  QDomNode local_58 [8];
  QDomNode local_50 [24];
  QString local_38;
  QString local_20;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *__lhs;
  undefined4 extraout_var_00;
  
  local_20.d.ptr = in_RDX;
  local_20.d.size = (qsizetype)in_RSI;
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffffe88);
  if (bVar1) {
    s1 = (QString *)local_20.d.size;
    tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
    this_01 = &local_38;
    qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_stack_fffffffffffffe68);
    QDomDocument::createElement(&local_20);
    QString::~QString((QString *)0x10db8c);
    if (local_20.d.ptr == (char16_t *)0x0) {
      QDomNode::appendChild(local_50);
      QDomNode::~QDomNode(local_50);
    }
    else {
      QDomNode::appendChild(local_58);
      QDomNode::~QDomNode(local_58);
    }
    local_60 = 1;
    local_68 = in_RDI + 1;
    local_70._M_current =
         (QString *)
         std::vector<QString,_std::allocator<QString>_>::begin
                   ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffe68);
    local_78 = (QString *)
               std::vector<QString,_std::allocator<QString>_>::end
                         ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffe68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                               *)in_stack_fffffffffffffe68), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                 ::operator*(&local_70);
      format_t<QString,_cfgfile::qstring_trait_t>::to_string(in_stack_fffffffffffffe68);
      to_cfgfile_format<cfgfile::qstring_trait_t>(in_stack_00000068);
      s2 = &local_98;
      qstring_wrapper_t::operator=
                ((qstring_wrapper_t *)in_stack_fffffffffffffe70,
                 (qstring_wrapper_t *)in_stack_fffffffffffffe68);
      qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x10dd01);
      qstring_wrapper_t::operator_cast_to_QString((qstring_wrapper_t *)in_stack_fffffffffffffe68);
      local_ca = const_t<cfgfile::qstring_trait_t>::c_quotes;
      in_stack_fffffffffffffe87 =
           QString::startsWith((QChar *)local_c8,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
      if ((in_stack_fffffffffffffe87 & 1) != 0) {
        local_cc = const_t<cfgfile::qstring_trait_t>::c_quotes;
        in_stack_fffffffffffffe86 =
             QString::endsWith((QChar *)local_c8,(uint)const_t<cfgfile::qstring_trait_t>::c_quotes);
        if ((in_stack_fffffffffffffe86 & 1) != 0) {
          QString::length(local_c8);
          QString::mid((longlong)local_e8,(longlong)local_c8);
          QString::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          QString::~QString((QString *)0x10ddee);
        }
      }
      QString::QString(this_01,(char *)s1);
      QString::number((ulong)local_130,(int)local_60);
      ::operator+(s1,s2);
      QDomElement::setAttribute(&local_20,&local_100);
      QString::~QString((QString *)0x10de99);
      QString::~QString((QString *)0x10dea3);
      QString::~QString((QString *)0x10deb0);
      local_60 = local_60 + 1;
      QString::~QString((QString *)0x10ded1);
      qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x10dede);
      __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
      ::operator++(&local_70);
    }
    iVar2 = (*in_RDI->_vptr_tag_t[2])();
    __lhs = (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
             *)CONCAT44(extraout_var,iVar2);
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ::empty((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                     *)CONCAT17(in_stack_fffffffffffffe87,
                                CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
    if (!bVar1) {
      iVar2 = (*in_RDI->_vptr_tag_t[2])();
      this_00 = (vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                 *)CONCAT44(extraout_var_00,iVar2);
      local_138 = this_00;
      local_140._M_current =
           (tag_t<cfgfile::qstring_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
           ::begin(this_00);
      std::
      vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                       *)this_00), bVar1) {
        pptVar3 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::operator*(&local_140);
        (*(*pptVar3)->_vptr_tag_t[4])(*pptVar3,local_20.d.size,&local_20);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::operator++(&local_140);
      }
    }
    QDomElement::~QDomElement((QDomElement *)0x10e039);
  }
  return;
}

Assistant:

void print( QDomDocument & doc, QDomElement * parent = 0 ) const override
	{
		if( this->is_defined() )
		{
			QDomElement this_element = doc.createElement( this->name() );

			if( !parent )
				doc.appendChild( this_element );
			else
				parent->appendChild( this_element );

			typename values_vector_t::size_type i = 1;

			for( const T & v : m_values )
			{
				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				QString tmp = value;

				if( tmp.startsWith( const_t< Trait >::c_quotes ) &&
					tmp.endsWith( const_t< Trait >::c_quotes ) )
						tmp = tmp.mid( 1, tmp.length() - 2 );

				this_element.setAttribute( QString( "a" ) + QString::number( i ),
					tmp );

				++i;
			}

			if( !this->children().empty() )
			{
				for( const tag_t< Trait > * tag : this->children() )
					tag->print( doc, &this_element );
			}
		}
	}